

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommMPI.cpp
# Opt level: O0

int __thiscall
adios2::helper::CommImplMPI::Win_lock
          (CommImplMPI *this,LockType lock_type,int rank,int assert,Win *win,string *hint)

{
  int iVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  undefined4 in_ECX;
  undefined4 in_EDX;
  LockType in_ESI;
  Win *in_R8;
  int ret;
  int mpi_lock_type;
  CommWinImplMPI *w;
  string *in_stack_000000b8;
  int in_stack_000000c4;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_78 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  
  lVar2 = adios2::helper::CommWinImpl::Get(in_R8);
  if (lVar2 == 0) {
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __dynamic_cast(lVar2,&CommWinImpl::typeinfo,&CommWinImplMPI::typeinfo,0);
  }
  __lhs = pbVar3;
  iVar1 = anon_unknown_1::ToMPI(in_ESI);
  iVar1 = MPI_Win_lock(iVar1,in_EDX,in_ECX,pbVar3->_M_string_length);
  __rhs = local_78;
  std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::operator+(__lhs,(char *)__rhs);
  anon_unknown_1::CheckMPIReturn(in_stack_000000c4,in_stack_000000b8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  std::__cxx11::string::~string(local_78);
  return iVar1;
}

Assistant:

int CommImplMPI::Win_lock(Comm::LockType lock_type, int rank, int assert, Comm::Win &win,
                          const std::string &hint) const
{
    CommWinImplMPI *w = dynamic_cast<CommWinImplMPI *>(CommWinImpl::Get(win));
    int mpi_lock_type = ToMPI(lock_type);
    int ret = MPI_Win_lock(mpi_lock_type, rank, assert, w->m_Win);
    CheckMPIReturn(ret, "in call to Win_Lock " + hint + "\n");
    return ret;
}